

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

double __thiscall Problem::getStateCost(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  ulong uVar1;
  vector<node,_std::allocator<node>_> *pvVar2;
  ulong uVar3;
  double dVar4;
  
  pvVar2 = this->problemData;
  uVar3 = 0;
  uVar1 = (ulong)(uint)this->numCompanies;
  if (this->numCompanies < 1) {
    uVar1 = uVar3;
  }
  dVar4 = 0.0;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    dVar4 = dVar4 + (pvVar2->super__Vector_base<node,_std::allocator<node>_>)._M_impl.
                    super__Vector_impl_data._M_start
                    [(bidNos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar3]].price;
    pvVar2 = pvVar2 + 1;
  }
  return dVar4;
}

Assistant:

double Problem::getStateCost(vector<int> bidNos) {
    double totalCost = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        double curcost = this->problemData[i][curBidNumber].price;
        totalCost += curcost;
    }
    return (totalCost);// - 1000000*getStateConflicts(bidNos));
}